

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.h
# Opt level: O2

void __thiscall minibag::BZ2Stream::~BZ2Stream(BZ2Stream *this)

{
  Stream::~Stream(&this->super_Stream);
  operator_delete(this,0x30);
  return;
}

Assistant:

class ROSBAG_STORAGE_DECL BZ2Stream : public Stream
{
public:
    BZ2Stream(ChunkedFile* file);

    CompressionType getCompressionType() const;

    void startWrite();
    void write(void* ptr, size_t size);
    void stopWrite();

    void startRead();
    void read(void* ptr, size_t size);
    void stopRead();

    void decompress(uint8_t* dest, unsigned int dest_len, uint8_t* source, unsigned int source_len);

private:
    int     verbosity_;        //!< level of debugging output (0-4; 0 default). 0 is silent, 4 is max verbose debugging output
    int     block_size_100k_;  //!< compression block size (1-9; 9 default). 9 is best compression, most memory
    int     work_factor_;      //!< compression behavior for worst case, highly repetitive data (0-250; 30 default)

    BZFILE* bzfile_;           //!< bzlib compressed file stream
    int     bzerror_;          //!< last error from bzlib
}